

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O1

void __thiscall OpenMD::HBondJumpZ::findHBonds(HBondJumpZ *this,int frame)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  Atom *pAVar4;
  long lVar5;
  long lVar6;
  pointer ppAVar7;
  MoleculeIterator MVar8;
  bool bVar9;
  Molecule *pMVar10;
  HBondDonor *pHVar11;
  long lVar12;
  long lVar13;
  pointer ppAVar14;
  long lVar15;
  Atom *pAVar16;
  pointer ppHVar17;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Vector3d hPos;
  Vector3d pos;
  Vector3d aPos;
  Vector3d dPos;
  Mat3x3d hmat;
  MoleculeIterator local_1f0;
  MoleculeIterator local_1e8;
  double local_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  pointer local_1b8;
  Atom *local_1b0;
  Vector3d local_1a8;
  Molecule *local_188;
  long local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  double dStack_150;
  double local_148;
  Vector3d local_138;
  Vector3d local_118;
  Vector3d local_f8;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  Mat3x3d local_78;
  
  local_1e8._M_node = (_Base_ptr)0x0;
  local_1f0._M_node = (_Base_ptr)0x0;
  local_148 = 0.0;
  local_158 = 0.0;
  dStack_150 = 0.0;
  local_1c8 = 0.0;
  local_1d8 = 0.0;
  dStack_1d0 = 0.0;
  local_168 = 0.0;
  local_178 = 0.0;
  dStack_170 = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[1] = 0.0;
  Snapshot::getHmat(&local_78,(this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_);
  local_1e0 = *(double *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
               + (ulong)(uint)this->axis_ * 0x20);
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e8);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      ppHVar17 = (pMVar10->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar17 ==
          (pMVar10->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar11 = (HBondDonor *)0x0;
      }
      else {
        pHVar11 = *ppHVar17;
      }
      while (pHVar11 != (HBondDonor *)0x0) {
        ppHVar17 = ppHVar17 + 1;
        (*(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
          _vptr_DynamicProperty[0x14])
                  (this,(ulong)(uint)frame,
                   (ulong)(uint)(pHVar11->donatedHydrogen->super_StuntDouble).globalIndex_);
        if (ppHVar17 ==
            (pMVar10->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar11 = (HBondDonor *)0x0;
        }
        else {
          pHVar11 = *ppHVar17;
        }
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e8);
    } while (pMVar10 != (Molecule *)0x0);
  }
  local_188 = SimInfo::beginMolecule
                        ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e8);
  if (local_188 != (Molecule *)0x0) {
    local_1e0 = local_1e0 * 0.5;
    local_180 = (long)frame;
    do {
      ppAVar14 = (pointer)(local_188->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      MVar8._M_node = local_1f0._M_node;
      local_1f0._M_node = local_1e8._M_node;
      ppAVar7 = local_1b8;
      if (ppAVar14 ==
          (pointer)(local_188->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        pAVar16 = (Atom *)0x0;
      }
      else {
        pAVar16 = *ppAVar14;
      }
      while (local_1b8 = ppAVar14, local_1e8._M_node = local_1f0._M_node, pAVar16 != (Atom *)0x0) {
        pAVar4 = (Atom *)(pAVar16->super_StuntDouble)._vptr_StuntDouble;
        iVar2 = ((*(Atom **)&(pAVar16->super_StuntDouble).objType_)->super_StuntDouble).globalIndex_
        ;
        local_1b0 = (Atom *)(local_180 * 3);
        iVar3 = *(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_180].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)iVar2 * 4);
        lVar5 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar4->super_StuntDouble).storage_);
        lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
        local_148 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
        pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
        local_158 = *pdVar1;
        dStack_150 = pdVar1[1];
        pAVar16 = *(Atom **)&(pAVar16->super_StuntDouble).objType_;
        lVar5 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar16->super_StuntDouble).storage_);
        lVar13 = (long)(pAVar16->super_StuntDouble).localIndex_;
        local_1c8 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
        pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
        local_1d8 = *pdVar1;
        dStack_1d0 = pdVar1[1];
        pMVar10 = SimInfo::beginMolecule
                            ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1f0);
        MVar8._M_node = local_1f0._M_node;
        local_1f0._M_node = local_1e8._M_node;
        ppAVar7 = local_1b8;
        while (pMVar10 != (Molecule *)0x0) {
          ppAVar14 = (pMVar10->hBondAcceptors_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_1e8._M_node = local_1f0._M_node;
          local_1b8 = ppAVar7;
          if (ppAVar14 ==
              (pMVar10->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar16 = (Atom *)0x0;
          }
          else {
            pAVar16 = *ppAVar14;
          }
          while (local_1f0._M_node = MVar8._M_node, pAVar16 != (Atom *)0x0) {
            ppAVar14 = ppAVar14 + 1;
            lVar13 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar5 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (pAVar16->super_StuntDouble).storage_);
            local_168 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
            pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
            local_178 = *pdVar1;
            dStack_170 = pdVar1[1];
            pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
            local_d8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_d8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_d8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
            local_b8.super_Vector<double,_3U>.data_[0] = local_1d8;
            local_b8.super_Vector<double,_3U>.data_[1] = dStack_1d0;
            local_b8.super_Vector<double,_3U>.data_[2] = local_1c8;
            local_98.super_Vector<double,_3U>.data_[0] = local_158;
            local_98.super_Vector<double,_3U>.data_[1] = dStack_150;
            local_98.super_Vector<double,_3U>.data_[2] = local_148;
            bVar9 = HBondJump::isHBond(&this->super_HBondJump,&local_98,&local_b8,&local_d8);
            if (bVar9) {
              HBondJump::registerHydrogenBond
                        (&this->super_HBondJump,frame,iVar3,iVar2,
                         (pAVar16->super_StuntDouble).globalIndex_);
              local_1a8.super_Vector<double,_3U>.data_[2] = local_1c8;
              local_1a8.super_Vector<double,_3U>.data_[0] = local_1d8;
              local_1a8.super_Vector<double,_3U>.data_[1] = dStack_1d0;
              if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                  UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
                Snapshot::wrapVector
                          ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                           &local_1a8);
              }
              (&(((this->zbin_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start)[(long)local_1b0][iVar3] =
                   (int)(((local_1a8.super_Vector<double,_3U>.data_[(uint)this->axis_] + local_1e0)
                         * (double)this->nZBins_) /
                        *(double *)
                         ((long)local_78.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
            }
            MVar8._M_node = local_1f0._M_node;
            if (ppAVar14 ==
                (pMVar10->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar16 = (Atom *)0x0;
            }
            else {
              pAVar16 = *ppAVar14;
            }
          }
          pMVar10 = SimInfo::nextMolecule
                              ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1f0);
          MVar8._M_node = local_1f0._M_node;
          local_1f0._M_node = local_1e8._M_node;
          ppAVar7 = local_1b8;
        }
        ppAVar14 = ppAVar7 + 1;
        if (ppAVar14 ==
            (pointer)(local_188->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
          pAVar16 = (Atom *)0x0;
        }
        else {
          pAVar16 = *ppAVar14;
        }
      }
      ppAVar14 = (local_188->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_1b8 = ppAVar7;
      while( true ) {
        local_1f0._M_node = MVar8._M_node;
        if (ppAVar14 ==
            (local_188->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar16 = (Atom *)0x0;
        }
        else {
          pAVar16 = *ppAVar14;
        }
        if (pAVar16 == (Atom *)0x0) break;
        lVar5 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar16->super_StuntDouble).storage_);
        lVar13 = (long)(pAVar16->super_StuntDouble).localIndex_;
        local_168 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
        pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
        local_178 = *pdVar1;
        dStack_170 = pdVar1[1];
        local_1f0._M_node = local_1e8._M_node;
        local_1b8 = ppAVar14;
        local_1b0 = pAVar16;
        pMVar10 = SimInfo::beginMolecule
                            ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1f0);
        while (pMVar10 != (Molecule *)0x0) {
          ppHVar17 = (pMVar10->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = local_180;
          if (ppHVar17 ==
              (pMVar10->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pHVar11 = (HBondDonor *)0x0;
          }
          else {
            pHVar11 = *ppHVar17;
          }
          while (local_180 = lVar5, pHVar11 != (HBondDonor *)0x0) {
            ppHVar17 = ppHVar17 + 1;
            pAVar16 = pHVar11->donorAtom;
            iVar2 = (pHVar11->donatedHydrogen->super_StuntDouble).globalIndex_;
            iVar3 = *(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + (long)iVar2 * 4);
            lVar15 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar13 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar16->super_StuntDouble).storage_);
            local_148 = *(double *)(lVar13 + 0x10 + lVar15 * 0x18);
            pdVar1 = (double *)(lVar13 + lVar15 * 0x18);
            local_158 = *pdVar1;
            dStack_150 = pdVar1[1];
            pAVar16 = pHVar11->donatedHydrogen;
            lVar12 = (long)(pAVar16->super_StuntDouble).localIndex_;
            lVar6 = *(long *)((long)&(((pAVar16->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (pAVar16->super_StuntDouble).storage_);
            local_1c8 = *(double *)(lVar6 + 0x10 + lVar12 * 0x18);
            pdVar1 = (double *)(lVar6 + lVar12 * 0x18);
            local_1d8 = *pdVar1;
            dStack_1d0 = pdVar1[1];
            local_f8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar15 * 0x18);
            pdVar1 = (double *)(lVar13 + lVar15 * 0x18);
            local_f8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_f8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_118.super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x10 + lVar12 * 0x18);
            pdVar1 = (double *)(lVar6 + lVar12 * 0x18);
            local_118.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_118.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_138.super_Vector<double,_3U>.data_[0] = local_178;
            local_138.super_Vector<double,_3U>.data_[1] = dStack_170;
            local_138.super_Vector<double,_3U>.data_[2] = local_168;
            bVar9 = HBondJump::isHBond(&this->super_HBondJump,&local_f8,&local_118,&local_138);
            if (bVar9) {
              HBondJump::registerHydrogenBond
                        (&this->super_HBondJump,frame,iVar3,iVar2,
                         (local_1b0->super_StuntDouble).globalIndex_);
              local_1a8.super_Vector<double,_3U>.data_[2] = local_1c8;
              local_1a8.super_Vector<double,_3U>.data_[0] = local_1d8;
              local_1a8.super_Vector<double,_3U>.data_[1] = dStack_1d0;
              if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                  UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
                Snapshot::wrapVector
                          ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                           &local_1a8);
              }
              *(int *)(*(long *)&(this->zbin_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)iVar3 * 4) =
                   (int)(((local_1a8.super_Vector<double,_3U>.data_[(uint)this->axis_] + local_1e0)
                         * (double)this->nZBins_) /
                        *(double *)
                         ((long)local_78.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
            }
            lVar5 = local_180;
            if (ppHVar17 ==
                (pMVar10->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pHVar11 = (HBondDonor *)0x0;
            }
            else {
              pHVar11 = *ppHVar17;
            }
          }
          pMVar10 = SimInfo::nextMolecule
                              ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1f0);
        }
        ppAVar14 = local_1b8 + 1;
        MVar8._M_node = local_1f0._M_node;
      }
      local_188 = SimInfo::nextMolecule
                            ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e8);
    } while (local_188 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJumpZ::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos, pos;
    int hInd, index, aInd, zBin;

    Mat3x3d hmat       = currentSnapshot_->getHmat();
    RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }
    }
  }